

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

void Saig_ManWindowOutline_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist,Vec_Ptr_t *vNodes,int *pDists)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int nDist_00;
  
  while( true ) {
    nDist_00 = nDist + -1;
    if (nDist_00 == -1) {
      return;
    }
    if (nDist <= pDists[pObj->Id]) {
      return;
    }
    pDists[pObj->Id] = nDist;
    iVar4 = pObj->TravId;
    iVar1 = p->nTravIds;
    pObj->TravId = iVar1;
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar6 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
    if (uVar6 == 1) {
      return;
    }
    if (uVar6 != 3) break;
    if ((pObj->field_0).CioId < p->nTruePos) {
      return;
    }
    if ((pObj->field_0).CioId < p->nTruePos) break;
    if ((pObj->field_0).CioId < p->nTruePos) {
      __assert_fail("Saig_ObjIsLi(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saig.h"
                    ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
    }
    uVar6 = ((pObj->field_0).CioId - p->nTruePos) + p->nTruePis;
    if (((int)uVar6 < 0) || (p->vCis->nSize <= (int)uVar6)) goto LAB_006c25b7;
    pAVar3 = (Aig_Obj_t *)p->vCis->pArray[uVar6];
    if (pAVar3->TravId != iVar1) {
      Saig_ManWindowOutline_rec(p,pAVar3,nDist,vNodes,pDists);
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    nDist = nDist_00;
  }
  if (iVar4 != iVar1) {
    Vec_PtrPush(vNodes,pObj);
  }
  uVar6 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar6 & 7) == 2) {
    if ((pObj->field_0).CioId < p->nTruePis) {
      return;
    }
    if (p->nTruePis <= (pObj->field_0).CioId) {
      pAVar3 = Saig_ObjLoToLi(p,pObj);
      if (pAVar3->TravId != p->nTravIds) {
        Saig_ManWindowOutline_rec(p,pAVar3,nDist,vNodes,pDists);
      }
      if (p->pFanData == (int *)0x0) {
        __assert_fail("p->pFanData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                      ,0x4e,
                      "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                     );
      }
      if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) == 0) {
        return;
      }
      uVar6 = 0xffffffff;
      uVar7 = 0;
      do {
        if (uVar7 == 0) {
          if (p->nFansAlloc <= pObj->Id) goto LAB_006c2633;
          iVar4 = pObj->Id * 5;
        }
        else {
          if (p->nFansAlloc <= (int)uVar6 / 2) goto LAB_006c2614;
          iVar4 = (uVar6 & 1) + ((int)uVar6 >> 1) * 5 + 3;
        }
        pVVar2 = p->vObjs;
        uVar6 = p->pFanData[iVar4];
        if (pVVar2 == (Vec_Ptr_t *)0x0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar5 = (int)uVar6 >> 1;
          if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006c25b7;
          pAVar3 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
        }
        Saig_ManWindowOutline_rec(p,pAVar3,nDist_00,vNodes,pDists);
        uVar7 = uVar7 + 1;
        if (*(uint *)&pObj->field_0x18 >> 6 <= uVar7) {
          return;
        }
      } while( true );
    }
  }
  if ((uVar6 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                  ,0x52,
                  "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  Saig_ManWindowOutline_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),nDist_00,vNodes,pDists);
  Saig_ManWindowOutline_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),nDist_00,vNodes,pDists);
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                  ,0x55,
                  "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) == 0) {
    return;
  }
  uVar6 = 0xffffffff;
  uVar7 = 0;
  do {
    if (uVar7 == 0) {
      if (p->nFansAlloc <= pObj->Id) {
LAB_006c2633:
        __assert_fail("ObjId < p->nFansAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                      ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
      }
      iVar4 = pObj->Id * 5;
    }
    else {
      if (p->nFansAlloc <= (int)uVar6 / 2) {
LAB_006c2614:
        __assert_fail("iFan/2 < p->nFansAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                      ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
      }
      iVar4 = (uVar6 & 1) + ((int)uVar6 >> 1) * 5 + 3;
    }
    pVVar2 = p->vObjs;
    uVar6 = p->pFanData[iVar4];
    if (pVVar2 == (Vec_Ptr_t *)0x0) {
      pAVar3 = (Aig_Obj_t *)0x0;
    }
    else {
      uVar5 = (int)uVar6 >> 1;
      if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) {
LAB_006c25b7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar3 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
    }
    Saig_ManWindowOutline_rec(p,pAVar3,nDist_00,vNodes,pDists);
    uVar7 = uVar7 + 1;
    if (*(uint *)&pObj->field_0x18 >> 6 <= uVar7) {
      return;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of PI/internal nodes.]

  Description [Marks all the visited nodes with the current ID.
  Does not collect constant node and PO/LI nodes.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManWindowOutline_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist, Vec_Ptr_t * vNodes, int * pDists )
{
    Aig_Obj_t * pMatch, * pFanout;
    int fCollected, iFanout = -1, i;
    if ( nDist == 0 )
        return;
    if ( pDists[pObj->Id] >= nDist )
        return;
    pDists[pObj->Id] = nDist;
    fCollected = Aig_ObjIsTravIdCurrent( p, pObj );
    Aig_ObjSetTravIdCurrent( p, pObj );    
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Saig_ObjIsPo(p, pObj) )
        return;
    if ( Saig_ObjIsLi(p, pObj) )
    {
        pMatch = Saig_ObjLiToLo( p, pObj );
        if ( !Aig_ObjIsTravIdCurrent( p, pMatch ) )
            Saig_ManWindowOutline_rec( p, pMatch, nDist, vNodes, pDists );
        Saig_ManWindowOutline_rec( p, Aig_ObjFanin0(pObj), nDist-1, vNodes, pDists );
        return;
    }
    if ( !fCollected )
        Vec_PtrPush( vNodes, pObj );
    if ( Saig_ObjIsPi(p, pObj) )
        return;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        pMatch = Saig_ObjLoToLi( p, pObj );
        if ( !Aig_ObjIsTravIdCurrent( p, pMatch ) )
            Saig_ManWindowOutline_rec( p, pMatch, nDist, vNodes, pDists );
        Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
            Saig_ManWindowOutline_rec( p, pFanout, nDist-1, vNodes, pDists );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManWindowOutline_rec( p, Aig_ObjFanin0(pObj), nDist-1, vNodes, pDists );
    Saig_ManWindowOutline_rec( p, Aig_ObjFanin1(pObj), nDist-1, vNodes, pDists );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Saig_ManWindowOutline_rec( p, pFanout, nDist-1, vNodes, pDists );
}